

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_rational.hpp
# Opt level: O2

void soplex::MPSwriteRecord
               (ostream *os,char *indicator,char *name,SPxOut *spxout,char *name1,Rational *value1,
               char *name2,Rational value2)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_00000010;
  Verbosity old_verbosity;
  char buf [81];
  
  lVar1 = std::ostream::tellp();
  if (indicator == (char *)0x0) {
    indicator = "";
  }
  if (name == (char *)0x0) {
    name = "";
  }
  spxSnprintf(buf,0x51," %-2.2s %-8.8s",indicator,name);
  std::operator<<(os,buf);
  if (name1 != (char *)0x0) {
    spxSnprintf(buf,0x51," %-8.8s ",name1);
    poVar2 = std::operator<<(os,buf);
    boost::multiprecision::operator<<(poVar2,value1);
    if (name2 != (char *)0x0) {
      spxSnprintf(buf,0x51," %-8.8s ",name2);
      poVar2 = std::operator<<(os,buf);
      boost::multiprecision::operator<<(poVar2,in_stack_00000010);
    }
  }
  std::endl<char,std::char_traits<char>>(os);
  lVar3 = std::ostream::tellp();
  if (((spxout != (SPxOut *)0x0) && (0x10000 < lVar3 - lVar1)) &&
     (old_verbosity = spxout->m_verbosity, 0 < (int)old_verbosity)) {
    (*spxout->_vptr_SPxOut[2])(spxout);
    operator<<(spxout,"XMPSWR04 Warning: SOPLEX_MAX_LINE_WRITE_LEN exceeded when writing MPS file\n"
              );
    (*spxout->_vptr_SPxOut[2])(spxout,&old_verbosity);
  }
  return;
}

Assistant:

static void MPSwriteRecord(
   std::ostream&  os,
   const char*    indicator,
   const char*    name,
   SPxOut* spxout,
   const char*    name1  = nullptr,
   const Rational value1 = 0,
   const char*    name2  = nullptr,
   const Rational value2 = 0
)
{
   char buf[81];
   long long pos;
   pos = os.tellp();

   spxSnprintf(buf, sizeof(buf), " %-2.2s %-8.8s", (indicator == nullptr) ? "" : indicator,
               (name == nullptr)      ? "" : name);
   os << buf;

   if(name1 != nullptr)
   {
      spxSnprintf(buf, sizeof(buf), " %-8.8s ", name1);
      os << buf << value1;

      if(name2 != nullptr)
      {
         spxSnprintf(buf, sizeof(buf), " %-8.8s ", name2);
         os << buf << value2;
      }
   }

   os << std::endl;

   // Warning if line is too long
   if((long long)(os.tellp()) - pos > SOPLEX_MAX_LINE_WRITE_LEN)
   {
      SPX_MSG_WARNING((*spxout), (*spxout) <<
                      "XMPSWR04 Warning: SOPLEX_MAX_LINE_WRITE_LEN exceeded when writing MPS file\n");
   }
}